

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_add.c
# Opt level: O0

int BN_sub(BIGNUM *r,BIGNUM *a,BIGNUM *b)

{
  int iVar1;
  BIGNUM *pBVar2;
  bool bVar3;
  BIGNUM *tmp;
  int neg;
  int add;
  int max;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint local_2c;
  BIGNUM *local_20;
  BIGNUM *local_18;
  int local_4;
  
  local_20 = b;
  local_18 = a;
  if (a->neg == 0) {
    bVar3 = b->neg != 0;
    local_2c = 0;
  }
  else {
    bVar3 = b->neg == 0;
    if (!bVar3) {
      local_20 = a;
      local_18 = b;
    }
    local_2c = (uint)bVar3;
  }
  if (bVar3) {
    iVar1 = BN_uadd(r,local_18,local_20);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      r->neg = local_2c;
      local_4 = 1;
    }
  }
  else {
    if (local_20->top < local_18->top) {
      iVar1 = local_18->top;
    }
    else {
      iVar1 = local_20->top;
    }
    pBVar2 = bn_wexpand((BIGNUM *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    if (pBVar2 == (BIGNUM *)0x0) {
      local_4 = 0;
    }
    else {
      iVar1 = BN_ucmp(local_18,local_20);
      if (iVar1 < 0) {
        iVar1 = BN_usub(r,local_20,local_18);
        if (iVar1 == 0) {
          return 0;
        }
        r->neg = 1;
      }
      else {
        iVar1 = BN_usub(r,local_18,local_20);
        if (iVar1 == 0) {
          return 0;
        }
        r->neg = 0;
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int BN_sub(BIGNUM *r, const BIGNUM *a, const BIGNUM *b)
{
    int max;
    int add = 0, neg = 0;

    bn_check_top(a);
    bn_check_top(b);

    /*-
     *  a -  b      a-b
     *  a - -b      a+b
     * -a -  b      -(a+b)
     * -a - -b      b-a
     */
    if (a->neg) {
        if (b->neg) {
            const BIGNUM *tmp;

            tmp = a;
            a = b;
            b = tmp;
        } else {
            add = 1;
            neg = 1;
        }
    } else {
        if (b->neg) {
            add = 1;
            neg = 0;
        }
    }

    if (add) {
        if (!BN_uadd(r, a, b))
            return 0;
        r->neg = neg;
        return 1;
    }

    /* We are actually doing a - b :-) */

    max = (a->top > b->top) ? a->top : b->top;
    if (bn_wexpand(r, max) == NULL)
        return 0;
    if (BN_ucmp(a, b) < 0) {
        if (!BN_usub(r, b, a))
            return 0;
        r->neg = 1;
    } else {
        if (!BN_usub(r, a, b))
            return 0;
        r->neg = 0;
    }
    bn_check_top(r);
    return 1;
}